

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orthographic_camera_estimation_linear.hpp
# Opt level: O2

ScaledOrthoProjectionParameters *
eos::fitting::estimate_orthographic_projection_linear
          (ScaledOrthoProjectionParameters *__return_storage_ptr__,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *image_points,
          vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          *model_points,bool is_viewport_upsidedown,optional<int> viewport_height)

{
  pointer pMVar1;
  pointer pMVar2;
  uint __line;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  SVar3;
  iterator __begin3;
  pointer pMVar4;
  MatrixUType *pMVar5;
  MatrixVType *pMVar6;
  runtime_error *this;
  long startRow;
  char *__assertion;
  ulong uVar7;
  long lVar8;
  int i;
  RealScalar RVar9;
  RealScalar RVar10;
  Scalar SVar11;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  float fVar16;
  Matrix<float,__1,_8,_0,__1,_8> A;
  Vector3f r2;
  Vector3f r1;
  Matrix<float,__1,_1,_0,__1,_1> b;
  Vector3f R2;
  Vector3f R1;
  Matrix3f R_ortho;
  Matrix<float,_8,_1,_0,_8,_1> k;
  Matrix3f R;
  undefined1 local_210 [8];
  RhsNested local_208;
  Matrix3f *local_200;
  variable_if_dynamic<long,__1> local_1f8;
  variable_if_dynamic<long,__1> local_1f0;
  Index local_1e8;
  JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0> svd;
  Matrix3f U;
  Matrix3f V;
  Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> local_60;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pMVar4 = (image_points->
           super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (image_points->
           super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar7 = (long)pMVar1 - (long)pMVar4 >> 3;
  if (uVar7 == (long)(model_points->
                     super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(model_points->
                     super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4) {
    if (3 < uVar7) {
      if (is_viewport_upsidedown) {
        if (((ulong)viewport_height.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> & 0x100000000) == 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,
                     "Error: If is_viewport_upsidedown is set to true, viewport_height needs to be given."
                    );
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        for (; pMVar4 != pMVar1; pMVar4 = pMVar4 + 1) {
          (pMVar4->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1] = (float)viewport_height.super__Optional_base<int,_true,_true>._M_payload.
                            super__Optional_payload_base<int>._M_payload -
                     (pMVar4->super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>).m_storage
                     .m_data.array[1];
        }
      }
      fVar16 = (float)((int)uVar7 * 2);
      Eigen::DenseBase<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>_>::Zero
                ((DenseBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)&svd,(long)(int)fVar16,8);
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,8,0,-1,8>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,8,0,_1,8>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,8,0,_1,8>> *)&A,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,_8,_0,__1,_8>_>_>
                  *)&svd);
      startRow = 1;
      lVar8 = 0;
      for (uVar7 = 0;
          pMVar2 = (model_points->
                   super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)(model_points->
                                super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 4);
          uVar7 = uVar7 + 1) {
        Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_1,_4,_false>::Block
                  ((Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_1,_4,_false> *)&svd,&A,
                   startRow + -1,0);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,1,4,false>,Eigen::Matrix<float,4,1,0,4,1>>
                  ((Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_1,_4,_false> *)&svd,
                   (Matrix<float,_4,_1,_0,_4,_1> *)
                   ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data + lVar8));
        pMVar2 = (model_points->
                 super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_1,_4,_false>::Block
                  ((Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_1,_4,_false> *)&svd,&A,startRow,4);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,1,4,false>,Eigen::Matrix<float,4,1,0,4,1>>
                  ((Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,_1,_4,_false> *)&svd,
                   (Matrix<float,_4,_1,_0,_4,_1> *)
                   ((long)&(pMVar2->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).
                           m_storage.m_data + lVar8));
        startRow = startRow + 2;
        lVar8 = lVar8 + 0x10;
      }
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = fVar16
      ;
      local_210._0_4_ = 1;
      Eigen::Matrix<float,-1,1,0,-1,1>::Matrix<int,int>
                ((Matrix<float,_1,1,0,_1,1> *)&b,(int *)&svd,(int *)local_210);
      for (uVar7 = 0;
          pMVar4 = (image_points->
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
          uVar7 < (ulong)((long)(image_points->
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3);
          uVar7 = uVar7 + 1) {
        Eigen::VectorBlock<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_2>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_2> *)&svd,&b,uVar7 * 2,2);
        *(undefined4 *)
         svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
         super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ =
             pMVar4[uVar7].super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
             m_data.array[0];
        *(float *)(svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array._0_8_ + 4) =
             *(float *)((long)&pMVar4[uVar7].
                               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                               .m_data + 4);
      }
      Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,8,0,-1,8>>::
      ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>
                ((ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>> *)&svd,
                 (EigenBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_> *)&A);
      _local_210 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,-1,8,0,-1,8>>>::
                   solve<Eigen::Matrix<float,_1,1,0,_1,1>>
                             ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>>
                               *)&svd,(MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&b);
      Eigen::PlainObjectBase<Eigen::Matrix<float,8,1,0,8,1>>::
      PlainObjectBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,_1,8,0,_1,8>>,Eigen::Matrix<float,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<float,8,1,0,8,1>> *)&k,
                 (DenseBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                  *)local_210);
      free((void *)svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.
                   m_matrixU.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array._0_8_);
      Eigen::VectorBlock<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3>::VectorBlock
                ((VectorBlock<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3> *)&svd,&k,0,3);
      Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<float,8,1,0,8,1>const,3,1,false>>
                ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&R1,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>_> *
                 )&svd);
      Eigen::VectorBlock<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3>::VectorBlock
                ((VectorBlock<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3> *)&svd,&k,4,3);
      Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<float,8,1,0,8,1>const,3,1,false>>
                ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&R2,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<float,_8,_1,_0,_8,_1>,_3,_1,_false>_> *
                 )&svd);
      RVar9 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                        ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&R1);
      RVar10 = Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&R2);
      Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
                ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&r1);
      Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
                ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&r2);
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           1.4013e-45;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ = &R;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_ = &R
      ;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Matrix<float,3,1,0,3,1>>
                ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&svd,&r1);
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ =
           R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 1;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           1.4013e-45;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           1.4013e-45;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_ = &R
      ;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Matrix<float,3,1,0,3,1>>
                ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&svd,&r2);
      SVar3 = _local_210;
      local_210._4_4_ =
           r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2] - r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0] *
                   r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2];
      local_210._0_4_ =
           r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
           * r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] - r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2] *
                   r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
      local_208.m_matrix._4_4_ = SVar3.m_rhs._4_4_;
      local_208.m_matrix._0_4_ =
           r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           * r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1] - r2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[0] *
                   r1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ =
           R.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array + 2;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
           2.8026e-45;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
           1.4013e-45;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixV.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      svd.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>.m_matrixU.
      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_ = &R
      ;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Matrix<float,3,1,0,3,1>>
                ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&svd,
                 (Matrix<float,_3,_1,_0,_3,_1> *)local_210);
      Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>::JacobiSVD(&svd,&R,0x14);
      pMVar5 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::matrixU
                         (&svd.
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
      ;
      U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           (pMVar5->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8];
      U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ =
           *(undefined8 *)
            (pMVar5->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array;
      U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._8_8_ =
           *(undefined8 *)
            ((pMVar5->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array + 2);
      U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_ =
           *(undefined8 *)
            ((pMVar5->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array + 4);
      U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._24_8_ =
           *(undefined8 *)
            ((pMVar5->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array + 6);
      pMVar6 = Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>::matrixV
                         (&svd.
                           super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>_>)
      ;
      V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._0_8_ =
           *(undefined8 *)
            (pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
            array;
      V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._8_8_ =
           *(undefined8 *)
            ((pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array + 2);
      V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._16_8_ =
           *(undefined8 *)
            ((pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array + 4);
      V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._24_8_ =
           *(undefined8 *)
            ((pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array + 6);
      V.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
           (pMVar6->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8];
      local_210 = (undefined1  [8])&U;
      local_208.m_matrix = &V;
      Eigen::PlainObjectBase<Eigen::Matrix<float,3,3,0,3,3>>::
      _set_noalias<Eigen::Product<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<float,3,3,0,3,3>const>,0>>
                ((PlainObjectBase<Eigen::Matrix<float,3,3,0,3,3>> *)&R_ortho,
                 (DenseBase<Eigen::Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>_>
                  *)local_210);
      SVar11 = Eigen::internal::determinant_impl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_3>::run
                         (&R_ortho);
      if (SVar11 < 0.0) {
        local_60.super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>.m_data =
             U.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
             2;
        local_1f8.m_value = 2;
        local_1f0.m_value = 0;
        local_1e8 = 1;
        local_60.super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startRow.
        m_value = 2;
        local_60.super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_startCol.
        m_value = 0;
        local_60.super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_outerStride
             = 1;
        local_200 = &U;
        local_60.super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.m_xpr = &U;
        local_210 = (undefined1  [8])
                    local_60.
                    super_BlockImpl<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_Eigen::Dense>.
                    super_BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>.
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>,_0>
                    .m_data;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>const>>
                  (&local_60,
                   (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false>_>
                    *)local_210);
        local_210 = (undefined1  [8])&U;
        local_208.m_matrix = &V;
        Eigen::internal::
        call_assignment<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Product<Eigen::Matrix<float,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<float,3,3,0,3,3>const>,0>>
                  (&R_ortho,(Product<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_0>
                             *)local_210);
      }
      (__return_storage_ptr__->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] =
           R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8];
      *(undefined8 *)
       ((__return_storage_ptr__->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array + 4) =
           R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array._16_8_;
      *(undefined8 *)
       ((__return_storage_ptr__->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array + 6) =
           R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array._24_8_;
      fVar16 = (RVar9 + RVar10) * 0.5;
      *(undefined8 *)
       (__return_storage_ptr__->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array =
           R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array._0_8_;
      *(undefined8 *)
       ((__return_storage_ptr__->R).super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array + 2) =
           R_ortho.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array._8_8_;
      auVar13._8_4_ =
           k.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4];
      auVar13._0_4_ =
           k.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3];
      auVar13._4_4_ =
           k.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4];
      auVar13._12_4_ =
           k.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6];
      auVar12._8_8_ = auVar13._8_8_;
      auVar12._0_4_ =
           k.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3];
      auVar12._4_4_ =
           k.super_PlainObjectBase<Eigen::Matrix<float,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7];
      auVar14._0_12_ = auVar12._0_12_;
      auVar14._12_4_ = 0;
      auVar15._4_4_ = fVar16;
      auVar15._0_4_ = fVar16;
      auVar15._8_4_ = extraout_XMM0_Db;
      auVar15._12_4_ = extraout_XMM0_Db;
      auVar15 = divps(auVar14,auVar15);
      __return_storage_ptr__->tx = (float)(int)auVar15._0_8_;
      __return_storage_ptr__->ty = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
      __return_storage_ptr__->s = fVar16;
      free(b.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(A.super_PlainObjectBase<Eigen::Matrix<float,__1,_8,_0,__1,_8>_>.m_storage.m_data);
      return __return_storage_ptr__;
    }
    __assertion = "image_points.size() >= 4";
    __line = 0x4e;
  }
  else {
    __assertion = "image_points.size() == model_points.size()";
    __line = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/orthographic_camera_estimation_linear.hpp"
                ,__line,
                "ScaledOrthoProjectionParameters eos::fitting::estimate_orthographic_projection_linear(std::vector<Eigen::Vector2f>, std::vector<Eigen::Vector4f>, bool, cpp17::optional<int>)"
               );
}

Assistant:

inline ScaledOrthoProjectionParameters estimate_orthographic_projection_linear(
    std::vector<Eigen::Vector2f> image_points, std::vector<Eigen::Vector4f> model_points,
    bool is_viewport_upsidedown, cpp17::optional<int> viewport_height = cpp17::nullopt)
{
    using Eigen::Matrix;
    assert(image_points.size() == model_points.size());
    assert(image_points.size() >= 4); // Number of correspondence points given needs to be equal to or larger than 4

    const int num_correspondences = static_cast<int>(image_points.size());

    if (is_viewport_upsidedown)
    {
        if (viewport_height == cpp17::nullopt)
        {
            throw std::runtime_error(
                "Error: If is_viewport_upsidedown is set to true, viewport_height needs to be given.");
        }
        for (auto&& ip : image_points)
        {
            ip[1] = viewport_height.value() - ip[1];
        }
    }

    Matrix<float, Eigen::Dynamic, 8> A = Matrix<float, Eigen::Dynamic, 8>::Zero(2 * num_correspondences, 8);
    for (int i = 0; i < model_points.size(); ++i)
    {
        A.block<1, 4>(2 * i, 0) = model_points[i];       // even row - copy to left side (first row is row 0)
        A.block<1, 4>((2 * i) + 1, 4) = model_points[i]; // odd row - copy to right side
    } // 4th coord (homogeneous) is already 1

    Matrix<float, Eigen::Dynamic, 1> b(2 * num_correspondences, 1);
    for (int i = 0; i < image_points.size(); ++i)
    {
        b.segment<2>(2 * i) = image_points[i];
    }

    // The original implementation used SVD here to solve the linear system, but
    // QR seems to do the job fine too.
    const Matrix<float, 8, 1> k = A.colPivHouseholderQr().solve(b); // resulting affine matrix (8x1)

    // Extract all values from the estimated affine parameters k:
    const Eigen::Vector3f R1 = k.segment<3>(0);
    const Eigen::Vector3f R2 = k.segment<3>(4);
    const float sTx = k(3);
    const float sTy = k(7);
    const auto s = (R1.norm() + R2.norm()) / 2.0f;
    Eigen::Matrix3f R;
    Eigen::Vector3f r1 = R1.normalized(); // Not sure why R1.normalize() (in-place) produces a compiler error.
    Eigen::Vector3f r2 = R2.normalized();
    R.block<1, 3>(0, 0) = r1;
    R.block<1, 3>(1, 0) = r2;
    R.block<1, 3>(2, 0) = r1.cross(r2);

    // Set R to the closest orthonormal matrix to the estimated affine transform:
    Eigen::JacobiSVD<Eigen::Matrix3f, Eigen::NoQRPreconditioner> svd(R, Eigen::ComputeFullU | Eigen::ComputeFullV);
    Eigen::Matrix3f U = svd.matrixU();
    const Eigen::Matrix3f V = svd.matrixV();
    Eigen::Matrix3f R_ortho = U * V.transpose();

    // The determinant of R must be 1 for it to be a valid rotation matrix
    if (R_ortho.determinant() < 0)
    {
        U.block<1, 3>(2, 0) = -U.block<1, 3>(2, 0); // not tested
        R_ortho = U * V.transpose();
    }

    // Remove the scale from the translations:
    const auto t1 = sTx / s;
    const auto t2 = sTy / s;

    return ScaledOrthoProjectionParameters{R_ortho, t1, t2, s};
}